

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_DCData.cpp
# Opt level: O0

h__Writer * __thiscall
ASDCP::DCData::MXFWriter::h__Writer::WriteFrame
          (h__Writer *this,FrameBuffer *FrameBuf,AESEncContext *Ctx,HMACContext *HMAC)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  undefined1 local_138 [8];
  IndexEntry Entry;
  ui64_t StreamOffset;
  undefined1 local_31;
  HMACContext *HMAC_local;
  AESEncContext *Ctx_local;
  FrameBuffer *FrameBuf_local;
  h__Writer *this_local;
  Result_t *result;
  
  local_31 = 0;
  HMAC_local = HMAC;
  Ctx_local = Ctx;
  FrameBuf_local = FrameBuf;
  this_local = this;
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  bVar2 = MXF::h__WriterState::Test_READY((h__WriterState *)(FrameBuf + 0x16));
  if (bVar2) {
    MXF::h__WriterState::Goto_RUNNING((h__WriterState *)&StreamOffset);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&StreamOffset);
    Kumu::Result_t::~Result_t((Result_t *)&StreamOffset);
  }
  uVar1 = *(undefined8 *)&FrameBuf[0x14].super_FrameBuffer.m_SourceLength;
  iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar3) {
    h__ASDCPWriter::WriteEKLVPacket
              ((h__ASDCPWriter *)&Entry.StreamOffset,&FrameBuf->super_FrameBuffer,
               (byte_t *)Ctx_local,(ui32_t *)&FrameBuf[0x2d].super_FrameBuffer.m_OwnMem,
               (AESEncContext *)&MXF_BER_LENGTH,HMAC_local);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&Entry.StreamOffset);
    Kumu::Result_t::~Result_t((Result_t *)&Entry.StreamOffset);
  }
  iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar3) {
    MXF::IndexTableSegment::IndexEntry::IndexEntry((IndexEntry *)local_138);
    Entry._8_8_ = uVar1;
    MXF::OPAtomIndexFooter::PushIndexEntry
              ((OPAtomIndexFooter *)&FrameBuf[0x22].super_FrameBuffer.m_Size,(IndexEntry *)local_138
              );
    FrameBuf[0x14].super_FrameBuffer.m_Size = FrameBuf[0x14].super_FrameBuffer.m_Size + 1;
    MXF::IndexTableSegment::IndexEntry::~IndexEntry((IndexEntry *)local_138);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::DCData::MXFWriter::h__Writer::WriteFrame(const FrameBuffer& FrameBuf,
                                                ASDCP::AESEncContext* Ctx, ASDCP::HMACContext* HMAC)
{
  Result_t result = RESULT_OK;

  if ( m_State.Test_READY() )
    result = m_State.Goto_RUNNING(); // first time through

  ui64_t StreamOffset = m_StreamOffset;

  if ( ASDCP_SUCCESS(result) )
    result = WriteEKLVPacket(FrameBuf, m_EssenceUL, MXF_BER_LENGTH, Ctx, HMAC);

  if ( ASDCP_SUCCESS(result) )
  {
    IndexTableSegment::IndexEntry Entry;
    Entry.StreamOffset = StreamOffset;
    m_FooterPart.PushIndexEntry(Entry);
    m_FramesWritten++;
  }
  return result;
}